

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompt.c
# Opt level: O1

wchar_t prompt_get(EditLine *el,el_pfunc_t *prf,wchar_t *c,wchar_t op)

{
  long lVar1;
  
  if (prf != (el_pfunc_t *)0x0) {
    lVar1 = 0x338;
    if (op == L'\0') {
      lVar1 = 800;
    }
    *prf = *(el_pfunc_t *)((long)&el->el_prog + lVar1);
    if (c != (wchar_t *)0x0) {
      *c = *(wchar_t *)((long)&el->el_outfile + lVar1);
    }
    return L'\0';
  }
  return L'\xffffffff';
}

Assistant:

libedit_private int
prompt_get(EditLine *el, el_pfunc_t *prf, wchar_t *c, int op)
{
	el_prompt_t *p;

	if (prf == NULL)
		return -1;

	if (op == EL_PROMPT)
		p = &el->el_prompt;
	else
		p = &el->el_rprompt;

	if (prf)
		*prf = p->p_func;
	if (c)
		*c = p->p_ignore;

	return 0;
}